

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O2

char * Cudd_zddCoverPathToString(DdManager *zdd,int *path,char *str)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  
  if (((zdd->sizeZ & 1U) == 0) &&
     ((uVar5 = zdd->sizeZ >> 1, str != (char *)0x0 ||
      (str = (char *)malloc((long)(int)(uVar5 + 1)), str != (char *)0x0)))) {
    uVar1 = 0;
    uVar2 = 0;
    if (0 < (int)uVar5) {
      uVar2 = (ulong)uVar5;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      uVar3 = path[uVar1 * 2] << 2 | path[uVar1 * 2 + 1];
      cVar4 = '?';
      if (uVar3 < 0xb) {
        cVar4 = (&DAT_007cfb60)[uVar3];
      }
      str[uVar1] = cVar4;
    }
    str[(int)uVar5] = '\0';
  }
  else {
    str = (char *)0x0;
  }
  return str;
}

Assistant:

char *
Cudd_zddCoverPathToString(
  DdManager *zdd                /* DD manager */,
  int *path                     /* path of ZDD representing a cover */,
  char *str                     /* pointer to string to use if != NULL */
  )
{
    int nvars = zdd->sizeZ;
    int i;
    char *res;

    if (nvars & 1) return(NULL);
    nvars >>= 1;
    if (str == NULL) {
        res = ABC_ALLOC(char, nvars+1);
        if (res == NULL) return(NULL);
    } else {
        res = str;
    }
    for (i = 0; i < nvars; i++) {
        int v = (path[2*i] << 2) | path[2*i+1];
        switch (v) {
        case 0:
        case 2:
        case 8:
        case 10:
            res[i] = '-';
            break;
        case 1:
        case 9:
            res[i] = '0';
            break;
        case 4:
        case 6:
            res[i] = '1';
            break;
        default:
            res[i] = '?';
        }
    }
    res[nvars] = 0;

    return(res);

}